

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O1

void __thiscall CircularBuffer<cv::Mat_*>::setMaxSize(CircularBuffer<cv::Mat_*> *this,uint new_size)

{
  uint i;
  Mat **ppMVar1;
  ulong uVar2;
  
  if (this->data != (Mat **)0x0) {
    operator_delete__(this->data);
  }
  this->count_of_elements = 0;
  this->first_element_index = 0;
  this->last_element_index = 0;
  this->count_of_slots = new_size;
  if (new_size == 0) {
    this->data = (Mat **)0x0;
  }
  else {
    ppMVar1 = (Mat **)operator_new__((ulong)new_size * 8);
    this->data = ppMVar1;
    uVar2 = 0;
    do {
      this->data[uVar2] = (Mat *)0x0;
      uVar2 = uVar2 + 1;
    } while (new_size != uVar2);
  }
  return;
}

Assistant:

void CircularBuffer<T *>::setMaxSize(unsigned int new_size)
{
    delete[] data;
    count_of_elements = 0;
    first_element_index = 0; //initial value is not important, these values are always set when elements are
    last_element_index = 0; //added or removed to/from buffer
    //we assume here that count_of_slots is bigger than 0
    count_of_slots = new_size;
    if(count_of_slots > 0) {
        data = new T *[count_of_slots];
        for(unsigned int i = 0; i < count_of_slots; i++) {
            data[i] = nullptr;
        }
    } else {
        data = nullptr;
    }
}